

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O1

OpenMPClause *
OpenMPIfClause::addIfClause
          (OpenMPDirective *directive,OpenMPIfClauseModifier modifier,char *user_defined_modifier)

{
  OpenMPIfClauseModifier OVar1;
  long lVar2;
  char *pcVar3;
  iterator __position;
  ulong uVar4;
  ulong uVar5;
  OpenMPIfClauseModifier OVar6;
  int iVar7;
  mapped_type *ppvVar8;
  size_t sVar9;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *pvVar10;
  OpenMPIfClause *pOVar11;
  ulong __n;
  long *plVar12;
  bool bVar13;
  bool bVar14;
  OpenMPClause *new_clause;
  string current_user_defined_modifier_expression;
  OpenMPIfClause *local_a8;
  OpenMPIfClauseModifier local_9c;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78 [2];
  long local_68 [2];
  OpenMPIfClause *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_98 = (undefined1 *)((ulong)local_98 & 0xffffffff00000000);
  ppvVar8 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_98);
  pvVar10 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)*ppvVar8;
  local_a8 = (OpenMPIfClause *)0x0;
  plVar12 = *(long **)pvVar10;
  if (*(long **)(pvVar10 + 8) == plVar12) {
    pOVar11 = (OpenMPIfClause *)operator_new(0x90);
    OpenMPIfClause(pOVar11,modifier);
    local_a8 = pOVar11;
    if (modifier == OMPC_IF_MODIFIER_user) {
      pcVar3 = (char *)(pOVar11->user_defined_modifier)._M_string_length;
      strlen(user_defined_modifier);
      std::__cxx11::string::_M_replace
                ((ulong)&pOVar11->user_defined_modifier,0,pcVar3,(ulong)user_defined_modifier);
    }
    pvVar10 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)pvVar10 = 0;
    *(undefined8 *)(pvVar10 + 8) = 0;
    *(undefined8 *)(pvVar10 + 0x10) = 0;
    if (*(undefined8 **)(pvVar10 + 8) == (undefined8 *)0x0) {
      std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
      _M_realloc_insert<OpenMPClause*const&>(pvVar10,(iterator)0x0,(OpenMPClause **)&local_a8);
    }
    else {
      **(undefined8 **)(pvVar10 + 8) = local_a8;
      *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
    }
    local_98 = (undefined1 *)((ulong)local_98 & 0xffffffff00000000);
    ppvVar8 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,(key_type *)&local_98);
    *ppvVar8 = (mapped_type)pvVar10;
    local_58 = local_a8;
  }
  else {
    bVar13 = plVar12 == *(long **)(pvVar10 + 8);
    OVar6 = modifier;
    OVar1 = local_9c;
    while (local_9c = OVar6, !bVar13) {
      local_98 = &local_88;
      local_90 = 0;
      local_88 = 0;
      if (user_defined_modifier != (char *)0x0) {
        local_78[0] = local_68;
        sVar9 = strlen(user_defined_modifier);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,user_defined_modifier,user_defined_modifier + sVar9);
        std::__cxx11::string::operator=((string *)&local_98,(string *)local_78);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
      OVar1 = *(OpenMPIfClauseModifier *)(*plVar12 + 0x68);
      if (OVar1 == modifier) {
        local_50 = local_40;
        lVar2 = *(long *)(*plVar12 + 0x70);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,lVar2,*(long *)(*plVar12 + 0x78) + lVar2);
        uVar5 = local_48;
        uVar4 = local_90;
        __n = local_90;
        if (local_48 < local_90) {
          __n = local_48;
        }
        if (__n == 0) {
          bVar14 = true;
        }
        else {
          iVar7 = bcmp(local_98,local_50,__n);
          bVar14 = iVar7 == 0;
        }
        bVar14 = (bool)(uVar4 == uVar5 & bVar14);
        modifier = local_9c;
      }
      else {
        bVar14 = false;
      }
      if ((OVar1 == modifier) && (local_50 != local_40)) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar14) {
        local_a8 = (OpenMPIfClause *)*plVar12;
        local_58 = local_a8;
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      OVar1 = local_9c;
      if (bVar14) break;
      plVar12 = plVar12 + 1;
      OVar6 = local_9c;
      bVar13 = plVar12 == *(long **)(pvVar10 + 8);
    }
    local_9c = OVar1;
    if (bVar13) {
      pOVar11 = (OpenMPIfClause *)operator_new(0x90);
      OpenMPIfClause(pOVar11,modifier);
      local_a8 = pOVar11;
      if (modifier == OMPC_IF_MODIFIER_user) {
        pcVar3 = (char *)(pOVar11->user_defined_modifier)._M_string_length;
        strlen(user_defined_modifier);
        std::__cxx11::string::_M_replace
                  ((ulong)&pOVar11->user_defined_modifier,0,pcVar3,(ulong)user_defined_modifier);
      }
      __position._M_current = *(OpenMPClause ***)(pvVar10 + 8);
      if (__position._M_current == *(OpenMPClause ***)(pvVar10 + 0x10)) {
        std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
        _M_realloc_insert<OpenMPClause*const&>(pvVar10,__position,(OpenMPClause **)&local_a8);
        local_58 = local_a8;
      }
      else {
        *__position._M_current = &local_a8->super_OpenMPClause;
        *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
        local_58 = local_a8;
      }
    }
  }
  return &local_58->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPIfClause::addIfClause(OpenMPDirective *directive, OpenMPIfClauseModifier modifier, char * user_defined_modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_if);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        };
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_if] = current_clauses;
    } else {
        for (std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {
            std::string current_user_defined_modifier_expression;
            if (user_defined_modifier) {
                current_user_defined_modifier_expression = std::string(user_defined_modifier);
            };
            if (((OpenMPIfClause*)(*it))->getModifier() == modifier &&
                current_user_defined_modifier_expression.compare(((OpenMPIfClause*)(*it))->getUserDefinedModifier()) == 0) {
                new_clause = (*it);
                return new_clause;
            };
        };
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        }
        current_clauses->push_back(new_clause);
    }
    return new_clause;
}